

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavingz.cpp
# Opt level: O1

void __thiscall
wavingz::demod::state_machine::sample_sm::bitlock_t::process
          (bitlock_t *this,sample_sm_t *ctx,optional<bool> *sample)

{
  bool bVar1;
  state_base_t *psVar2;
  symbol_sm_t *psVar3;
  state_base_t *psVar4;
  state_base_t *psVar5;
  double dVar6;
  undefined1 local_14 [4];
  
  if ((sample->super_type).m_initialized == false) {
    (**((((ctx->sym_sm)._M_data)->current_state_m)._M_t.
        super___uniq_ptr_impl<wavingz::demod::state_machine::symbol_sm::state_base_t,_std::default_delete<wavingz::demod::state_machine::symbol_sm::state_base_t>_>
        ._M_t.
        super__Tuple_impl<0UL,_wavingz::demod::state_machine::symbol_sm::state_base_t_*,_std::default_delete<wavingz::demod::state_machine::symbol_sm::state_base_t>_>
        .super__Head_base<0UL,_wavingz::demod::state_machine::symbol_sm::state_base_t_*,_false>.
       _M_head_impl)->_vptr_state_base_t)();
    psVar5 = (state_base_t *)operator_new(8);
    psVar5->_vptr_state_base_t = (_func_int **)&PTR_process_00118d20;
    psVar2 = (ctx->current_state_m)._M_t.
             super___uniq_ptr_impl<wavingz::demod::state_machine::sample_sm::state_base_t,_std::default_delete<wavingz::demod::state_machine::sample_sm::state_base_t>_>
             ._M_t.
             super__Tuple_impl<0UL,_wavingz::demod::state_machine::sample_sm::state_base_t_*,_std::default_delete<wavingz::demod::state_machine::sample_sm::state_base_t>_>
             .super__Head_base<0UL,_wavingz::demod::state_machine::sample_sm::state_base_t_*,_false>
             ._M_head_impl;
    (ctx->current_state_m)._M_t.
    super___uniq_ptr_impl<wavingz::demod::state_machine::sample_sm::state_base_t,_std::default_delete<wavingz::demod::state_machine::sample_sm::state_base_t>_>
    ._M_t.
    super__Tuple_impl<0UL,_wavingz::demod::state_machine::sample_sm::state_base_t_*,_std::default_delete<wavingz::demod::state_machine::sample_sm::state_base_t>_>
    .super__Head_base<0UL,_wavingz::demod::state_machine::sample_sm::state_base_t_*,_false>.
    _M_head_impl = psVar5;
    if (psVar2 != (state_base_t *)0x0) {
      operator_delete(psVar2);
    }
  }
  else {
    bVar1 = (sample->super_type).m_storage;
    if (bVar1 == this->last_sample) {
      dVar6 = this->num_samples + 1.0;
    }
    else {
      this->last_sample = bVar1;
      dVar6 = this->samples_per_symbol * 3.0 * 0.25;
    }
    this->num_samples = dVar6;
    if (this->samples_per_symbol <= this->num_samples) {
      psVar3 = (ctx->sym_sm)._M_data;
      psVar4 = (psVar3->current_state_m)._M_t.
               super___uniq_ptr_impl<wavingz::demod::state_machine::symbol_sm::state_base_t,_std::default_delete<wavingz::demod::state_machine::symbol_sm::state_base_t>_>
               ._M_t.
               super__Tuple_impl<0UL,_wavingz::demod::state_machine::symbol_sm::state_base_t_*,_std::default_delete<wavingz::demod::state_machine::symbol_sm::state_base_t>_>
               .
               super__Head_base<0UL,_wavingz::demod::state_machine::symbol_sm::state_base_t_*,_false>
               ._M_head_impl;
      (**psVar4->_vptr_state_base_t)(psVar4,psVar3,local_14);
      this->num_samples = this->num_samples - this->samples_per_symbol;
    }
  }
  return;
}

Assistant:

void
bitlock_t::process(sample_sm_t& ctx, const boost::optional<bool>& sample)
{
    // On no signal, return to idle
    if (sample == boost::none)
    {
        ctx.emit(boost::none);
        ctx.state(std::unique_ptr<idle_t>(new idle_t()));
    }
    else
    {
        if(*sample != last_sample)
        {
            last_sample = *sample;
            num_samples = 3.0 * samples_per_symbol / 4.0;
        }
        else
        {
            num_samples = num_samples + 1.0;
        }
        if (num_samples >= samples_per_symbol)
        {
            ctx.emit(*sample);
            num_samples -= samples_per_symbol; // keep alignment
        }
    }
}